

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

ssize_t compress_out(archive_write *a,void *buff,size_t s,la_zaction run)

{
  long lVar1;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  int in_ECX;
  void *in_RDX;
  archive_write *in_RSI;
  long in_RDI;
  uint64_t bytes;
  int r;
  _7zip *zip;
  la_zaction in_stack_ffffffffffffffbc;
  la_zstream *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd8;
  void *local_8;
  
  lVar1 = *(long *)(in_RDI + 0xd0);
  if (((in_ECX == 0) && (*(long *)(lVar1 + 0x98) == 0)) && (in_RDX == (void *)0x0)) {
    local_8 = (void *)0x0;
  }
  else {
    if (((*(uint *)(lVar1 + 0x7c) & 1) != 0) && (in_RDX != (void *)0x0)) {
      uVar2 = crc32(*(undefined4 *)(lVar1 + 0x74),in_RSI,(ulong)in_RDX & 0xffffffff);
      *(undefined4 *)(lVar1 + 0x74) = uVar2;
    }
    *(archive_write **)(lVar1 + 0x88) = in_RSI;
    *(void **)(lVar1 + 0x90) = in_RDX;
LAB_00174893:
    do {
      in_stack_ffffffffffffffcc =
           compression_code((archive *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                            ,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if ((in_stack_ffffffffffffffcc != 0) && (in_stack_ffffffffffffffcc != 1)) {
        return -0x1e;
      }
      if (*(long *)(lVar1 + 0xa8) == 0) {
        iVar3 = write_to_temp(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
        if (iVar3 != 0) {
          return -0x1e;
        }
        *(long *)(lVar1 + 0xa0) = lVar1 + 0x108;
        *(undefined8 *)(lVar1 + 0xa8) = 0xf000;
        if ((*(uint *)(lVar1 + 0x7c) & 2) != 0) {
          uVar2 = crc32(*(undefined4 *)(lVar1 + 0x78),lVar1 + 0x108,0xf000);
          *(undefined4 *)(lVar1 + 0x78) = uVar2;
        }
        if ((in_ECX == 0) && (in_stack_ffffffffffffffcc != 1)) goto LAB_00174893;
      }
    } while (*(long *)(lVar1 + 0x90) != 0);
    local_8 = in_RDX;
    if (in_ECX == 0) {
      uVar4 = 0xf000 - *(long *)(lVar1 + 0xa8);
      iVar3 = write_to_temp(in_RSI,in_RDX,(ulong)in_stack_ffffffffffffffd8);
      if (iVar3 == 0) {
        local_8 = in_RDX;
        if (((*(uint *)(lVar1 + 0x7c) & 2) != 0) && (uVar4 != 0)) {
          uVar2 = crc32(*(undefined4 *)(lVar1 + 0x78),lVar1 + 0x108,uVar4 & 0xffffffff);
          *(undefined4 *)(lVar1 + 0x78) = uVar2;
          local_8 = in_RDX;
        }
      }
      else {
        local_8 = (void *)0xffffffffffffffe2;
      }
    }
  }
  return (ssize_t)local_8;
}

Assistant:

static ssize_t
compress_out(struct archive_write *a, const void *buff, size_t s,
    enum la_zaction run)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	int r;

	if (run == ARCHIVE_Z_FINISH && zip->stream.total_in == 0 && s == 0)
		return (0);

	if ((zip->crc32flg & PRECODE_CRC32) && s)
		zip->precode_crc32 = crc32(zip->precode_crc32, buff,
		    (unsigned)s);
	zip->stream.next_in = (const unsigned char *)buff;
	zip->stream.avail_in = s;
	for (;;) {
		/* Compress file data. */
		r = compression_code(&(a->archive), &(zip->stream), run);
		if (r != ARCHIVE_OK && r != ARCHIVE_EOF)
			return (ARCHIVE_FATAL);
		if (zip->stream.avail_out == 0) {
			if (write_to_temp(a, zip->wbuff, sizeof(zip->wbuff))
			    != ARCHIVE_OK)
				return (ARCHIVE_FATAL);
			zip->stream.next_out = zip->wbuff;
			zip->stream.avail_out = sizeof(zip->wbuff);
			if (zip->crc32flg & ENCODED_CRC32)
				zip->encoded_crc32 = crc32(zip->encoded_crc32,
				    zip->wbuff, sizeof(zip->wbuff));
			if (run == ARCHIVE_Z_FINISH && r != ARCHIVE_EOF)
				continue;
		}
		if (zip->stream.avail_in == 0)
			break;
	}
	if (run == ARCHIVE_Z_FINISH) {
		uint64_t bytes = sizeof(zip->wbuff) - zip->stream.avail_out;
		if (write_to_temp(a, zip->wbuff, (size_t)bytes) != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		if ((zip->crc32flg & ENCODED_CRC32) && bytes)
			zip->encoded_crc32 = crc32(zip->encoded_crc32,
			    zip->wbuff, (unsigned)bytes);
	}

	return (s);
}